

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_splitter.cc
# Opt level: O0

void brotli::SplitBlock(Command *cmds,size_t num_commands,uint8_t *data,size_t pos,size_t mask,
                       BlockSplit *literal_split,BlockSplit *insert_and_copy_split,
                       BlockSplit *dist_split)

{
  pointer *this;
  undefined1 local_90 [8];
  vector<unsigned_short,_std::allocator<unsigned_short>_> distance_prefixes;
  vector<unsigned_short,_std::allocator<unsigned_short>_> insert_and_copy_codes;
  undefined1 local_50 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> literals;
  BlockSplit *literal_split_local;
  size_t mask_local;
  size_t pos_local;
  uint8_t *data_local;
  size_t num_commands_local;
  Command *cmds_local;
  
  literals.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)literal_split;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50);
  CopyLiteralsToByteArray
            (cmds,num_commands,data,pos,mask,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50);
  this = &distance_prefixes.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage;
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)this);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_90);
  CopyCommandsToByteArray
            (cmds,num_commands,(vector<unsigned_short,_std::allocator<unsigned_short>_> *)this,
             (vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_90);
  SplitByteVector<brotli::Histogram<256>,unsigned_char>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50,0x220,100,0x46,28.1,
             (BlockSplit *)
             literals.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage);
  SplitByteVector<brotli::Histogram<704>,unsigned_short>
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
             &distance_prefixes.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,0x212,0x32,0x28,13.5,
             insert_and_copy_split);
  SplitByteVector<brotli::Histogram<520>,unsigned_short>
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_90,0x220,0x32,0x28,
             14.6,dist_split);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::~vector
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_90);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::~vector
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
             &distance_prefixes.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50);
  return;
}

Assistant:

void SplitBlock(const Command* cmds,
                const size_t num_commands,
                const uint8_t* data,
                const size_t pos,
                const size_t mask,
                BlockSplit* literal_split,
                BlockSplit* insert_and_copy_split,
                BlockSplit* dist_split) {
  // Create a continuous array of literals.
  std::vector<uint8_t> literals;
  CopyLiteralsToByteArray(cmds, num_commands, data, pos, mask, &literals);

  // Compute prefix codes for commands.
  std::vector<uint16_t> insert_and_copy_codes;
  std::vector<uint16_t> distance_prefixes;
  CopyCommandsToByteArray(cmds, num_commands,
                          &insert_and_copy_codes,
                          &distance_prefixes);

  SplitByteVector<HistogramLiteral>(
      literals,
      kSymbolsPerLiteralHistogram, kMaxLiteralHistograms,
      kLiteralStrideLength, kLiteralBlockSwitchCost,
      literal_split);
  SplitByteVector<HistogramCommand>(
      insert_and_copy_codes,
      kSymbolsPerCommandHistogram, kMaxCommandHistograms,
      kCommandStrideLength, kCommandBlockSwitchCost,
      insert_and_copy_split);
  SplitByteVector<HistogramDistance>(
      distance_prefixes,
      kSymbolsPerDistanceHistogram, kMaxCommandHistograms,
      kCommandStrideLength, kDistanceBlockSwitchCost,
      dist_split);
}